

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diffs.h
# Opt level: O0

void __thiscall libDAI::Diffs::push(Diffs *this,double x)

{
  bool bVar1;
  pointer pdVar2;
  size_type sVar3;
  reference pdVar4;
  reference pvVar5;
  iterator iVar6;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var7;
  vector<double,_std::allocator<double>_> *in_RDI;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *in_XMM0_Qa;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff68;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff70;
  int iVar9;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *p_Var8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  *in_stack_ffffffffffffff78;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff80;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff88;
  double dVar10;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_68;
  double *local_60;
  double *local_58;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_48;
  double *local_40;
  double *local_38;
  double *local_20;
  double *local_18;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *local_10;
  
  local_10 = in_XMM0_Qa;
  pdVar2 = (pointer)std::vector<double,_std::allocator<double>_>::size(in_RDI);
  if (pdVar2 < in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start) {
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_ffffffffffffff80,(value_type_conflict3 *)in_stack_ffffffffffffff78);
    local_18 = (double *)
               std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff68);
    in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = local_18;
    sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RDI);
    if (sVar3 < 2) {
      iVar6 = std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff68);
      in_RDI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = iVar6._M_current;
    }
    else {
      pdVar4 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                            *)(in_RDI + 2));
      dVar10 = *pdVar4;
      pvVar5 = std::vector<double,_std::allocator<double>_>::back(in_stack_ffffffffffffff70);
      iVar9 = (int)((ulong)in_stack_ffffffffffffff70 >> 0x20);
      if (dVar10 < *pvVar5) {
        local_20 = (double *)
                   std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff68);
        in_RDI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = local_20;
        __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
        operator--(in_stack_ffffffffffffff78,iVar9);
      }
    }
  }
  else {
    _Var7._M_current =
         (double *)
         &in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
    local_38 = (double *)
               std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff68);
    bVar1 = __gnu_cxx::operator==
                      ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )in_stack_ffffffffffffff70,
                       (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )in_stack_ffffffffffffff68);
    if (bVar1) {
      local_40 = (double *)
                 std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff68);
      in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = local_40;
    }
    bVar1 = __gnu_cxx::operator==
                      ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )in_stack_ffffffffffffff70,
                       (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )in_stack_ffffffffffffff68);
    if (bVar1) {
      local_48 = __gnu_cxx::
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator++(local_10,(int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
      pdVar4 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(&local_48);
      *pdVar4 = (double)local_10;
      local_58 = (double *)
                 std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff68);
      local_60 = (double *)
                 std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff68);
      _Var7 = std::
              max_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                        (in_stack_ffffffffffffff88,_Var7);
      in_RDI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = _Var7._M_current;
    }
    else {
      p_Var8 = local_10;
      pdVar4 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                            *)(in_RDI + 2));
      if (*pdVar4 < (double)p_Var8) {
        in_RDI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start =
             in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
      }
      local_68 = __gnu_cxx::
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator++(in_stack_ffffffffffffff78,(int)((ulong)p_Var8 >> 0x20));
      pdVar4 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(&local_68);
      *pdVar4 = (double)local_10;
    }
  }
  return;
}

Assistant:

void push(double x) {
                if( size() < _maxsize ) {
                    push_back(x);
                    _pos = end();
                    if( size() > 1 ) {
                        if( *_maxpos < back() ) {
                            _maxpos = end();
                            _maxpos--;
                        }
                    } else {
                        _maxpos = begin();
                    }
                }
                else {
                    if( _pos == end() )
                        _pos = begin();
                    if( _maxpos == _pos ) {
                        *_pos++ = x; 
                        _maxpos = max_element(begin(),end());
                    } else {
                        if( x > *_maxpos )
                            _maxpos = _pos;
                        *_pos++ = x;
                    }
                }
            }